

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::InterpretArgument
          (CommandLineInterface *this,string *name,string *value)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  second_type *psVar6;
  mapped_type *pmVar7;
  int version;
  long lVar8;
  char *pcVar9;
  char cVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__return_storage_ptr__;
  string *psVar11;
  ulong uVar12;
  string virtual_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string disk_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  direct;
  _Alloc_hider local_78;
  undefined1 local_70 [24];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  *local_38;
  
  if (name->_M_string_length == 0) {
    if (value->_M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->input_files_,value);
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "You seem to have passed an empty string as one of the arguments to ");
    poVar5 = std::operator<<(poVar5,(string *)this);
    pcVar9 = 
    ".  This is actually sort of hard to do.  Congrats.  Unfortunately it is not valid input so the program is going to die now."
    ;
  }
  else {
    bVar2 = std::operator==(name,"-I");
    if ((bVar2) || (bVar2 = std::operator==(name,"--proto_path"), bVar2)) {
      uVar12 = 0xffffffffffffffff;
      Split(&parts,value,":",true);
      local_38 = (vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&this->proto_path_;
      lVar8 = 0;
      while (uVar12 = uVar12 + 1,
            uVar12 < (ulong)((long)parts.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)parts.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        virtual_path._M_dataplus._M_p = (pointer)&virtual_path.field_2;
        virtual_path._M_string_length = 0;
        disk_path._M_dataplus._M_p = (pointer)&disk_path.field_2;
        disk_path._M_string_length = 0;
        virtual_path.field_2._M_local_buf[0] = '\0';
        disk_path.field_2._M_local_buf[0] = '\0';
        lVar4 = std::__cxx11::string::find
                          ((char)parts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (char)lVar8,0x3d);
        if (lVar4 == -1) {
          std::__cxx11::string::assign((char *)&virtual_path);
          std::__cxx11::string::_M_assign((string *)&disk_path);
        }
        else {
          std::__cxx11::string::substr
                    ((ulong)&direct,
                     (long)&((parts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8)
          ;
          std::__cxx11::string::operator=((string *)&virtual_path,(string *)&direct);
          std::__cxx11::string::~string((string *)&direct);
          std::__cxx11::string::substr
                    ((ulong)&direct,
                     (long)&((parts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8)
          ;
          std::__cxx11::string::operator=((string *)&disk_path,(string *)&direct);
          std::__cxx11::string::~string((string *)&direct);
        }
        sVar1 = disk_path._M_string_length;
        if (disk_path._M_string_length == 0) {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "--proto_path passed empty directory name.  (Use \".\" for current directory.)"
                                  );
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        else {
          iVar3 = access(disk_path._M_dataplus._M_p,0);
          if (iVar3 < 0) {
            iVar3 = access(*(char **)((long)&((parts.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar8),0);
            if (iVar3 < 0) {
              poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&disk_path);
              poVar5 = std::operator<<(poVar5,": warning: directory does not exist.");
              std::endl<char,std::char_traits<char>>(poVar5);
            }
            else {
              std::__cxx11::string::assign((char *)&virtual_path);
              std::__cxx11::string::_M_assign((string *)&disk_path);
            }
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&direct,&virtual_path,&disk_path);
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    (local_38,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&direct);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&direct);
        }
        lVar8 = lVar8 + 0x20;
        std::__cxx11::string::~string((string *)&disk_path);
        std::__cxx11::string::~string((string *)&virtual_path);
        if (sVar1 == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&parts);
          return PARSE_ARGUMENT_FAIL;
        }
      }
      __return_storage_ptr__ = &parts;
LAB_0026dcc1:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(__return_storage_ptr__);
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    bVar2 = std::operator==(name,"--direct_dependencies");
    if (bVar2) {
      if (this->direct_dependencies_explicitly_set_ != true) {
        this->direct_dependencies_explicitly_set_ = true;
        Split(&direct,value,":",true);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->direct_dependencies_,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )direct.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )direct.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        __return_storage_ptr__ = &direct;
        goto LAB_0026dcc1;
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)name);
      pcVar9 = 
      " may only be passed once. To specify multiple direct dependencies, pass them all as a single parameter separated by \':\'."
      ;
    }
    else {
      bVar2 = std::operator==(name,"--direct_dependencies_violation_msg");
      if (bVar2) {
        psVar11 = (string *)&this->direct_dependencies_violation_msg_;
        goto LAB_0026dd6d;
      }
      bVar2 = std::operator==(name,"--descriptor_set_in");
      if (bVar2) {
        if ((this->descriptor_set_in_names_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->descriptor_set_in_names_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (value->_M_string_length == 0) {
LAB_0026df27:
            poVar5 = std::operator<<((ostream *)&std::cerr,(string *)name);
            pcVar9 = " requires a non-empty value.";
          }
          else {
            if ((this->dependency_out_name_)._M_string_length == 0) {
              __return_storage_ptr__ = &direct;
              Split(__return_storage_ptr__,value,":",true);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_move_assign(&this->descriptor_set_in_names_,__return_storage_ptr__);
              goto LAB_0026dcc1;
            }
            poVar5 = std::operator<<((ostream *)&std::cerr,(string *)name);
            pcVar9 = " cannot be used with --dependency_out.";
          }
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cerr,(string *)name);
          poVar5 = std::operator<<(poVar5,
                                   " may only be passed once. To specify multiple descriptor sets, pass them all as a single parameter separated by \'"
                                  );
          poVar5 = std::operator<<(poVar5,":");
          pcVar9 = "\'.";
        }
      }
      else {
        bVar2 = std::operator==(name,"-o");
        if ((bVar2) || (bVar2 = std::operator==(name,"--descriptor_set_out"), bVar2)) {
          if ((this->descriptor_set_out_name_)._M_string_length == 0) {
            if (value->_M_string_length == 0) goto LAB_0026df27;
            if (this->mode_ == MODE_COMPILE) {
              psVar11 = (string *)&this->descriptor_set_out_name_;
              goto LAB_0026dd6d;
            }
            poVar5 = (ostream *)&std::cerr;
            pcVar9 = "Cannot use --encode or --decode and generate descriptors at the same time.";
            goto LAB_0026dd2c;
          }
        }
        else {
          bVar2 = std::operator==(name,"--dependency_out");
          if (bVar2) {
            if ((this->dependency_out_name_)._M_string_length == 0) {
              if (value->_M_string_length == 0) goto LAB_0026df27;
              if ((this->descriptor_set_in_names_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  (this->descriptor_set_in_names_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                psVar11 = (string *)&this->dependency_out_name_;
                goto LAB_0026dd6d;
              }
              poVar5 = std::operator<<((ostream *)&std::cerr,(string *)name);
              pcVar9 = " cannot be used with --descriptor_set_in.";
              goto LAB_0026dd2c;
            }
          }
          else {
            bVar2 = std::operator==(name,"--include_imports");
            if (bVar2) {
              if (this->imports_in_descriptor_set_ != true) {
                this->imports_in_descriptor_set_ = true;
                return PARSE_ARGUMENT_DONE_AND_CONTINUE;
              }
            }
            else {
              bVar2 = std::operator==(name,"--include_source_info");
              if (!bVar2) {
                bVar2 = std::operator==(name,"-h");
                if ((bVar2) || (bVar2 = std::operator==(name,"--help"), bVar2)) {
                  PrintHelpText(this);
                  return PARSE_ARGUMENT_DONE_AND_EXIT;
                }
                bVar2 = std::operator==(name,"--version");
                if (bVar2) {
                  if ((this->version_info_)._M_string_length != 0) {
                    poVar5 = std::operator<<((ostream *)&std::cout,(string *)&this->version_info_);
                    std::endl<char,std::char_traits<char>>(poVar5);
                  }
                  poVar5 = std::operator<<((ostream *)&std::cout,"libprotoc ");
                  internal::VersionString_abi_cxx11_((string *)&direct,(internal *)0x2de9e9,version)
                  ;
                  poVar5 = std::operator<<(poVar5,(string *)&direct);
                  std::endl<char,std::char_traits<char>>(poVar5);
                  std::__cxx11::string::~string((string *)&direct);
                  return PARSE_ARGUMENT_DONE_AND_EXIT;
                }
                bVar2 = std::operator==(name,"--disallow_services");
                if (bVar2) {
                  this->disallow_services_ = true;
                  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                }
                bVar2 = std::operator==(name,"--encode");
                if (((bVar2) || (bVar2 = std::operator==(name,"--decode"), bVar2)) ||
                   (bVar2 = std::operator==(name,"--decode_raw"), bVar2)) {
                  if (this->mode_ == MODE_COMPILE) {
                    if (((this->output_directives_).
                         super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                         ._M_impl.super__Vector_impl_data._M_start ==
                         (this->output_directives_).
                         super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                         ._M_impl.super__Vector_impl_data._M_finish) &&
                       ((this->descriptor_set_out_name_)._M_string_length == 0)) {
                      bVar2 = std::operator==(name,"--encode");
                      this->mode_ = MODE_DECODE - bVar2;
                      if (value->_M_string_length == 0) {
                        bVar2 = std::operator!=(name,"--decode_raw");
                        if (bVar2) {
                          poVar5 = std::operator<<((ostream *)&std::cerr,"Type name for ");
                          poVar5 = std::operator<<(poVar5,(string *)name);
                          poVar5 = std::operator<<(poVar5," cannot be blank.");
                          std::endl<char,std::char_traits<char>>(poVar5);
                          bVar2 = std::operator==(name,"--decode");
                          if (!bVar2) {
                            return PARSE_ARGUMENT_FAIL;
                          }
                          pcVar9 = "To decode an unknown message, use --decode_raw.";
                          goto LAB_0026e2ff;
                        }
                        if (value->_M_string_length != 0) goto LAB_0026e16d;
                      }
                      else {
LAB_0026e16d:
                        bVar2 = std::operator==(name,"--decode_raw");
                        if (bVar2) {
                          pcVar9 = "--decode_raw does not take a parameter.";
LAB_0026e2ff:
                          poVar5 = std::operator<<((ostream *)&std::cerr,pcVar9);
                          std::endl<char,std::char_traits<char>>(poVar5);
                          return PARSE_ARGUMENT_FAIL;
                        }
                      }
                      psVar11 = (string *)&this->codec_type_;
LAB_0026dd6d:
                      std::__cxx11::string::_M_assign(psVar11);
                      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                    }
LAB_0026e49c:
                    poVar5 = std::operator<<((ostream *)&std::cerr,"Cannot use ");
                    poVar5 = std::operator<<(poVar5,(string *)name);
                    pcVar9 = " and generate code or descriptors at the same time.";
                  }
                  else {
                    poVar5 = (ostream *)&std::cerr;
                    pcVar9 = "Only one of --encode and --decode can be specified.";
                  }
                }
                else {
                  bVar2 = std::operator==(name,"--error_format");
                  if (bVar2) {
                    bVar2 = std::operator==(value,"gcc");
                    if (bVar2) {
                      this->error_format_ = ERROR_FORMAT_GCC;
                      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                    }
                    bVar2 = std::operator==(value,"msvs");
                    if (bVar2) {
                      this->error_format_ = ERROR_FORMAT_MSVS;
                      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                    }
                    poVar5 = std::operator<<((ostream *)&std::cerr,"Unknown error format: ");
LAB_0026e3c9:
                    poVar5 = std::operator<<(poVar5,(string *)value);
                    goto LAB_0026dd31;
                  }
                  bVar2 = std::operator==(name,"--plugin");
                  cVar10 = (char)value;
                  if (bVar2) {
                    if ((this->plugin_prefix_)._M_string_length != 0) {
                      direct.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)&direct.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      direct.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      direct.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                      virtual_path._M_dataplus._M_p = (pointer)&virtual_path.field_2;
                      virtual_path._M_string_length = 0;
                      virtual_path.field_2._M_local_buf[0] = '\0';
                      lVar8 = std::__cxx11::string::find(cVar10,0x3d);
                      if (lVar8 == -1) {
                        lVar8 = std::__cxx11::string::rfind(cVar10,0x2f);
                        if (lVar8 == -1) {
                          std::__cxx11::string::_M_assign((string *)&direct);
                        }
                        else {
                          std::__cxx11::string::substr((ulong)&disk_path,(ulong)value);
                          std::__cxx11::string::operator=((string *)&direct,(string *)&disk_path);
                          std::__cxx11::string::~string((string *)&disk_path);
                        }
                        std::__cxx11::string::_M_assign((string *)&virtual_path);
                      }
                      else {
                        std::__cxx11::string::substr((ulong)&disk_path,(ulong)value);
                        std::__cxx11::string::operator=((string *)&direct,(string *)&disk_path);
                        std::__cxx11::string::~string((string *)&disk_path);
                        std::__cxx11::string::substr((ulong)&disk_path,(ulong)value);
                        std::__cxx11::string::operator=
                                  ((string *)&virtual_path,(string *)&disk_path);
                        std::__cxx11::string::~string((string *)&disk_path);
                      }
                      pmVar7 = std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator[](&this->plugins_,(key_type *)&direct);
                      std::__cxx11::string::_M_assign((string *)pmVar7);
                      std::__cxx11::string::~string((string *)&virtual_path);
                      std::__cxx11::string::~string((string *)&direct);
                      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                    }
                    poVar5 = (ostream *)&std::cerr;
                    pcVar9 = "This compiler does not support plugins.";
                  }
                  else {
                    bVar2 = std::operator==(name,"--print_free_field_numbers");
                    if (bVar2) {
                      if (this->mode_ == MODE_COMPILE) {
                        if (((this->output_directives_).
                             super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                             ._M_impl.super__Vector_impl_data._M_start ==
                             (this->output_directives_).
                             super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                             ._M_impl.super__Vector_impl_data._M_finish) &&
                           ((this->descriptor_set_out_name_)._M_string_length == 0)) {
                          this->mode_ = MODE_PRINT;
                          this->print_mode_ = PRINT_FREE_FIELDS;
                          return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                        }
                        goto LAB_0026e49c;
                      }
                      poVar5 = std::operator<<((ostream *)&std::cerr,"Cannot use ");
                      poVar5 = std::operator<<(poVar5,(string *)name);
                      poVar5 = std::operator<<(poVar5," and use --encode, --decode or print ");
                      pcVar9 = "other info at the same time.";
                    }
                    else {
                      psVar6 = FindOrNull<std::map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>>
                                         (&this->generators_by_flag_name_,name);
                      if (psVar6 == (second_type *)0x0) {
                        if ((this->plugin_prefix_)._M_string_length != 0) {
                          std::__cxx11::string::string
                                    ((string *)&direct,"_out",(allocator *)&virtual_path);
                          bVar2 = HasSuffixString(name,(string *)&direct);
                          std::__cxx11::string::~string((string *)&direct);
                          if (bVar2) goto LAB_0026e3eb;
                        }
                        psVar6 = FindOrNull<std::map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>>
                                           (&this->generators_by_option_name_,name);
                        if (psVar6 != (second_type *)0x0) {
                          pmVar7 = std::
                                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator[](&this->generator_parameters_,&psVar6->flag_name);
                          sVar1 = pmVar7->_M_string_length;
joined_r0x0026e73d:
                          if (sVar1 != 0) {
                            std::__cxx11::string::append((char *)pmVar7);
                          }
                          std::__cxx11::string::append((string *)pmVar7);
                          return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                        }
                        std::__cxx11::string::string((string *)&direct,"--",(allocator *)&disk_path)
                        ;
                        bVar2 = HasPrefixString(name,(string *)&direct);
                        if (bVar2) {
                          std::__cxx11::string::string
                                    ((string *)&virtual_path,"_opt",(allocator *)&parts);
                          bVar2 = HasSuffixString(name,&virtual_path);
                          std::__cxx11::string::~string((string *)&virtual_path);
                          std::__cxx11::string::~string((string *)&direct);
                          if (bVar2) {
                            anon_unknown_4::PluginName((string *)&direct,&this->plugin_prefix_,name)
                            ;
                            pmVar7 = std::
                                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ::operator[](&this->plugin_parameters_,(string *)&direct);
                            std::__cxx11::string::~string((string *)&direct);
                            sVar1 = pmVar7->_M_string_length;
                            goto joined_r0x0026e73d;
                          }
                        }
                        else {
                          std::__cxx11::string::~string((string *)&direct);
                        }
                        poVar5 = std::operator<<((ostream *)&std::cerr,"Unknown flag: ");
                        value = name;
                        goto LAB_0026e3c9;
                      }
LAB_0026e3eb:
                      if (this->mode_ == MODE_COMPILE) {
                        direct.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                             (pointer)&direct.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        direct.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        direct.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                        local_78._M_p = local_70 + 8;
                        local_70._0_8_ = 0;
                        local_70[8] = '\0';
                        local_58._M_p = (pointer)&local_48;
                        local_50 = 0;
                        local_48._M_local_buf[0] = '\0';
                        std::__cxx11::string::_M_assign((string *)&direct);
                        lVar8 = std::__cxx11::string::find(cVar10,0x3a);
                        if (lVar8 == -1) {
                          std::__cxx11::string::_M_assign((string *)&local_58);
                        }
                        else {
                          std::__cxx11::string::substr((ulong)&virtual_path,(ulong)value);
                          std::__cxx11::string::operator=
                                    ((string *)&local_78,(string *)&virtual_path);
                          std::__cxx11::string::~string((string *)&virtual_path);
                          std::__cxx11::string::substr((ulong)&virtual_path,(ulong)value);
                          std::__cxx11::string::operator=
                                    ((string *)&local_58,(string *)&virtual_path);
                          std::__cxx11::string::~string((string *)&virtual_path);
                        }
                        std::
                        vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                        ::push_back(&this->output_directives_,(value_type *)&direct);
                        OutputDirective::~OutputDirective((OutputDirective *)&direct);
                        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                      }
                      poVar5 = (ostream *)&std::cerr;
                      pcVar9 = 
                      "Cannot use --encode, --decode or print .proto info and generate code at the same time."
                      ;
                    }
                  }
                }
                goto LAB_0026dd2c;
              }
              if (this->source_info_in_descriptor_set_ != true) {
                this->source_info_in_descriptor_set_ = true;
                return PARSE_ARGUMENT_DONE_AND_CONTINUE;
              }
            }
          }
        }
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)name);
        pcVar9 = " may only be passed once.";
      }
    }
  }
LAB_0026dd2c:
  poVar5 = std::operator<<(poVar5,pcVar9);
LAB_0026dd31:
  std::endl<char,std::char_traits<char>>(poVar5);
  return PARSE_ARGUMENT_FAIL;
}

Assistant:

CommandLineInterface::ParseArgumentStatus
CommandLineInterface::InterpretArgument(const std::string& name,
                                        const std::string& value) {
  if (name.empty()) {
    // Not a flag.  Just a filename.
    if (value.empty()) {
      std::cerr
          << "You seem to have passed an empty string as one of the "
             "arguments to "
          << executable_name_
          << ".  This is actually "
             "sort of hard to do.  Congrats.  Unfortunately it is not valid "
             "input so the program is going to die now."
          << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

#if defined(_WIN32)
    // On Windows, the shell (typically cmd.exe) does not expand wildcards in
    // file names (e.g. foo\*.proto), so we do it ourselves.
    switch (google::protobuf::io::win32::ExpandWildcards(
        value,
        [this](const string& path) { this->input_files_.push_back(path); })) {
      case google::protobuf::io::win32::ExpandWildcardsResult::kSuccess:
        break;
      case google::protobuf::io::win32::ExpandWildcardsResult::
          kErrorNoMatchingFile:
        // Path does not exist, is not a file, or it's longer than MAX_PATH and
        // long path handling is disabled.
        std::cerr << "Invalid file name pattern or missing input file \""
                  << value << "\"" << std::endl;
        return PARSE_ARGUMENT_FAIL;
      default:
        std::cerr << "Cannot convert path \"" << value
                  << "\" to or from Windows style" << std::endl;
        return PARSE_ARGUMENT_FAIL;
    }
#else   // not _WIN32
    // On other platforms than Windows (e.g. Linux, Mac OS) the shell (typically
    // Bash) expands wildcards.
    input_files_.push_back(value);
#endif  // _WIN32

  } else if (name == "-I" || name == "--proto_path") {
    // Java's -classpath (and some other languages) delimits path components
    // with colons.  Let's accept that syntax too just to make things more
    // intuitive.
    std::vector<std::string> parts = Split(
        value, CommandLineInterface::kPathSeparator,
        true);

    for (int i = 0; i < parts.size(); i++) {
      std::string virtual_path;
      std::string disk_path;

      std::string::size_type equals_pos = parts[i].find_first_of('=');
      if (equals_pos == std::string::npos) {
        virtual_path = "";
        disk_path = parts[i];
      } else {
        virtual_path = parts[i].substr(0, equals_pos);
        disk_path = parts[i].substr(equals_pos + 1);
      }

      if (disk_path.empty()) {
        std::cerr
            << "--proto_path passed empty directory name.  (Use \".\" for "
               "current directory.)"
            << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      // Make sure disk path exists, warn otherwise.
      if (access(disk_path.c_str(), F_OK) < 0) {
        // Try the original path; it may have just happened to have a '=' in it.
        if (access(parts[i].c_str(), F_OK) < 0) {
          std::cerr << disk_path << ": warning: directory does not exist."
                    << std::endl;
        } else {
          virtual_path = "";
          disk_path = parts[i];
        }
      }

      // Don't use make_pair as the old/default standard library on Solaris
      // doesn't support it without explicit template parameters, which are
      // incompatible with C++0x's make_pair.
      proto_path_.push_back(
          std::pair<std::string, std::string>(virtual_path, disk_path));
    }

  } else if (name == "--direct_dependencies") {
    if (direct_dependencies_explicitly_set_) {
      std::cerr << name
                << " may only be passed once. To specify multiple "
                   "direct dependencies, pass them all as a single "
                   "parameter separated by ':'."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    direct_dependencies_explicitly_set_ = true;
    std::vector<std::string> direct =
        Split(value, ":", true);
    GOOGLE_DCHECK(direct_dependencies_.empty());
    direct_dependencies_.insert(direct.begin(), direct.end());

  } else if (name == "--direct_dependencies_violation_msg") {
    direct_dependencies_violation_msg_ = value;

  } else if (name == "--descriptor_set_in") {
    if (!descriptor_set_in_names_.empty()) {
      std::cerr << name
                << " may only be passed once. To specify multiple "
                   "descriptor sets, pass them all as a single "
                   "parameter separated by '"
                << CommandLineInterface::kPathSeparator << "'." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!dependency_out_name_.empty()) {
      std::cerr << name << " cannot be used with --dependency_out."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    descriptor_set_in_names_ = Split(
        value, CommandLineInterface::kPathSeparator,
        true);

  } else if (name == "-o" || name == "--descriptor_set_out") {
    if (!descriptor_set_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (mode_ != MODE_COMPILE) {
      std::cerr
          << "Cannot use --encode or --decode and generate descriptors at the "
             "same time."
          << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    descriptor_set_out_name_ = value;

  } else if (name == "--dependency_out") {
    if (!dependency_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!descriptor_set_in_names_.empty()) {
      std::cerr << name << " cannot be used with --descriptor_set_in."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    dependency_out_name_ = value;

  } else if (name == "--include_imports") {
    if (imports_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    imports_in_descriptor_set_ = true;

  } else if (name == "--include_source_info") {
    if (source_info_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    source_info_in_descriptor_set_ = true;

  } else if (name == "-h" || name == "--help") {
    PrintHelpText();
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--version") {
    if (!version_info_.empty()) {
      std::cout << version_info_ << std::endl;
    }
    std::cout << "libprotoc " << internal::VersionString(PROTOBUF_VERSION)
              << std::endl;
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--disallow_services") {
    disallow_services_ = true;

  } else if (name == "--encode" || name == "--decode" ||
             name == "--decode_raw") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Only one of --encode and --decode can be specified."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_out_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    mode_ = (name == "--encode") ? MODE_ENCODE : MODE_DECODE;

    if (value.empty() && name != "--decode_raw") {
      std::cerr << "Type name for " << name << " cannot be blank." << std::endl;
      if (name == "--decode") {
        std::cerr << "To decode an unknown message, use --decode_raw."
                  << std::endl;
      }
      return PARSE_ARGUMENT_FAIL;
    } else if (!value.empty() && name == "--decode_raw") {
      std::cerr << "--decode_raw does not take a parameter." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    codec_type_ = value;

  } else if (name == "--error_format") {
    if (value == "gcc") {
      error_format_ = ERROR_FORMAT_GCC;
    } else if (value == "msvs") {
      error_format_ = ERROR_FORMAT_MSVS;
    } else {
      std::cerr << "Unknown error format: " << value << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

  } else if (name == "--plugin") {
    if (plugin_prefix_.empty()) {
      std::cerr << "This compiler does not support plugins." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    std::string plugin_name;
    std::string path;

    std::string::size_type equals_pos = value.find_first_of('=');
    if (equals_pos == std::string::npos) {
      // Use the basename of the file.
      std::string::size_type slash_pos = value.find_last_of('/');
      if (slash_pos == std::string::npos) {
        plugin_name = value;
      } else {
        plugin_name = value.substr(slash_pos + 1);
      }
      path = value;
    } else {
      plugin_name = value.substr(0, equals_pos);
      path = value.substr(equals_pos + 1);
    }

    plugins_[plugin_name] = path;

  } else if (name == "--print_free_field_numbers") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Cannot use " << name
                << " and use --encode, --decode or print "
                << "other info at the same time." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_out_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    mode_ = MODE_PRINT;
    print_mode_ = PRINT_FREE_FIELDS;
  } else {
    // Some other flag.  Look it up in the generators list.
    const GeneratorInfo* generator_info =
        FindOrNull(generators_by_flag_name_, name);
    if (generator_info == NULL &&
        (plugin_prefix_.empty() || !HasSuffixString(name, "_out"))) {
      // Check if it's a generator option flag.
      generator_info = FindOrNull(generators_by_option_name_, name);
      if (generator_info != NULL) {
        std::string* parameters =
            &generator_parameters_[generator_info->flag_name];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else if (HasPrefixString(name, "--") && HasSuffixString(name, "_opt")) {
        std::string* parameters =
            &plugin_parameters_[PluginName(plugin_prefix_, name)];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else {
        std::cerr << "Unknown flag: " << name << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }
    } else {
      // It's an output flag.  Add it to the output directives.
      if (mode_ != MODE_COMPILE) {
        std::cerr << "Cannot use --encode, --decode or print .proto info and "
                     "generate code at the same time."
                  << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      OutputDirective directive;
      directive.name = name;
      if (generator_info == NULL) {
        directive.generator = NULL;
      } else {
        directive.generator = generator_info->generator;
      }

      // Split value at ':' to separate the generator parameter from the
      // filename.  However, avoid doing this if the colon is part of a valid
      // Windows-style absolute path.
      std::string::size_type colon_pos = value.find_first_of(':');
      if (colon_pos == std::string::npos || IsWindowsAbsolutePath(value)) {
        directive.output_location = value;
      } else {
        directive.parameter = value.substr(0, colon_pos);
        directive.output_location = value.substr(colon_pos + 1);
      }

      output_directives_.push_back(directive);
    }
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}